

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O1

int left_of_aliens_proc(Am_Object *param_1)

{
  char cVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object this_alien;
  Am_Value_List aliens;
  Am_Object local_28;
  Am_Value_List local_20 [16];
  
  pAVar3 = (Am_Value *)Am_Object::Get(0x82f8,0x82);
  Am_Value_List::Am_Value_List(local_20,pAVar3);
  local_28.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start();
  do {
    cVar1 = Am_Value_List::Last();
    if (cVar1 != '\0') {
      iVar2 = 0;
LAB_0010490c:
      Am_Object::~Am_Object(&local_28);
      Am_Value_List::~Am_Value_List(local_20);
      return iVar2;
    }
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_28,pAVar3);
    Am_Object::Get((ushort)&local_28,0xb0);
    cVar1 = Am_Value::Valid();
    if (cVar1 != '\0') {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_28,100);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      iVar2 = 10 - iVar2;
      goto LAB_0010490c;
    }
    Am_Value_List::Next();
  } while( true );
}

Assistant:

Am_Define_No_Self_Formula(int, left_of_aliens)
{
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object this_alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    this_alien = aliens.Get();
    if (this_alien.Get(Am_IMAGE).Valid())
      return 10 - (int)this_alien.Get(Am_LEFT);
  }
  return 0;
}